

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O2

void anon_unknown.dwarf_352::PrintCommands
               (Edge *edge,set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *seen,
               PrintCommandMode mode)

{
  bool bVar1;
  pointer ppNVar2;
  pair<std::_Rb_tree_iterator<Edge_*>,_bool> pVar3;
  Edge *edge_local;
  string local_38;
  
  if (edge != (Edge *)0x0) {
    edge_local = edge;
    pVar3 = std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>
            ::_M_insert_unique<Edge*const&>
                      ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>
                        *)seen,&edge_local);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (mode == PCM_All) {
        for (ppNVar2 = (edge_local->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            ppNVar2 !=
            (edge_local->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppNVar2 = ppNVar2 + 1) {
          PrintCommands((*ppNVar2)->in_edge_,seen,PCM_All);
        }
      }
      bVar1 = Edge::is_phony(edge_local);
      if (!bVar1) {
        Edge::EvaluateCommand_abi_cxx11_(&local_38,edge_local,false);
        puts(local_38._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_38);
      }
    }
  }
  return;
}

Assistant:

void PrintCommands(Edge* edge, set<Edge*>* seen, PrintCommandMode mode) {
  if (!edge)
    return;
  if (!seen->insert(edge).second)
    return;

  if (mode == PCM_All) {
    for (vector<Node*>::iterator in = edge->inputs_.begin();
         in != edge->inputs_.end(); ++in)
      PrintCommands((*in)->in_edge(), seen, mode);
  }

  if (!edge->is_phony())
    puts(edge->EvaluateCommand().c_str());
}